

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O2

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig fbconfig;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *__s1;
  GLXFBConfig *pp_Var4;
  _GLFWfbconfig *alternatives;
  _GLFWfbconfig *p_Var5;
  uint uVar6;
  long lVar7;
  size_t __nmemb;
  int nativeCount;
  GLXFBConfig *local_40;
  _GLFWfbconfig *local_38;
  
  local_38 = desired;
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  iVar1 = strcmp(__s1,"Chromium");
  pp_Var4 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&nativeCount);
  __nmemb = (size_t)nativeCount;
  if (__nmemb == 0) {
    uVar6 = 0;
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
  }
  else {
    local_40 = result;
    alternatives = (_GLFWfbconfig *)calloc(__nmemb,0x48);
    uVar6 = 0;
    for (lVar7 = 0; lVar7 < (int)__nmemb; lVar7 = lVar7 + 1) {
      fbconfig = pp_Var4[lVar7];
      uVar2 = getGLXFBConfigAttrib(fbconfig,0x8011);
      if ((uVar2 & 1) != 0) {
        uVar2 = getGLXFBConfigAttrib(fbconfig,0x8010);
        if ((iVar1 == 0) || ((uVar2 & 1) != 0)) {
          p_Var5 = alternatives + (int)uVar6;
          iVar3 = getGLXFBConfigAttrib(fbconfig,8);
          p_Var5->redBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,9);
          p_Var5->greenBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,10);
          p_Var5->blueBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,0xb);
          p_Var5->alphaBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,0xc);
          p_Var5->depthBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,0xd);
          p_Var5->stencilBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,0xe);
          p_Var5->accumRedBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,0xf);
          p_Var5->accumGreenBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,0x10);
          p_Var5->accumBlueBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,0x11);
          p_Var5->accumAlphaBits = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,7);
          p_Var5->auxBuffers = iVar3;
          iVar3 = getGLXFBConfigAttrib(fbconfig,6);
          if (iVar3 != 0) {
            p_Var5->stereo = 1;
          }
          iVar3 = getGLXFBConfigAttrib(fbconfig,5);
          if (iVar3 != 0) {
            p_Var5->doublebuffer = 1;
          }
          if (_glfw.glx.ARB_multisample != 0) {
            iVar3 = getGLXFBConfigAttrib(fbconfig,0x186a1);
            p_Var5->samples = iVar3;
          }
          if (_glfw.glx.EXT_framebuffer_sRGB != 0 || _glfw.glx.ARB_framebuffer_sRGB != 0) {
            iVar3 = getGLXFBConfigAttrib(fbconfig,0x20b2);
            p_Var5->sRGB = iVar3;
          }
          p_Var5->handle = (uintptr_t)fbconfig;
          uVar6 = uVar6 + 1;
        }
      }
      __nmemb = (size_t)(uint)nativeCount;
    }
    p_Var5 = _glfwChooseFBConfig(local_38,alternatives,uVar6);
    if (p_Var5 != (_GLFWfbconfig *)0x0) {
      *local_40 = (GLXFBConfig)p_Var5->handle;
    }
    uVar6 = (uint)(p_Var5 != (_GLFWfbconfig *)0x0);
    XFree(pp_Var4);
    free(alternatives);
  }
  return uVar6;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired, GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;
        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER))
            u->doublebuffer = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}